

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPPacket.h
# Opt level: O0

void __thiscall SNMPPacket::SNMPPacket(SNMPPacket *this)

{
  SNMPPacket *this_local;
  
  this->_vptr_SNMPPacket = (_func_int **)&PTR__SNMPPacket_0028f7f0;
  this->reuse = false;
  Catch::clara::std::shared_ptr<IntegerType>::shared_ptr
            ((shared_ptr<IntegerType> *)&this->requestIDPtr,(nullptr_t)0x0);
  Catch::clara::std::shared_ptr<IntegerType>::shared_ptr
            ((shared_ptr<IntegerType> *)&this->snmpVersionPtr,(nullptr_t)0x0);
  Catch::clara::std::shared_ptr<OctetType>::shared_ptr
            ((shared_ptr<OctetType> *)&this->communityStringPtr,(nullptr_t)0x0);
  this->requestID = 0;
  this->snmpVersion = SNMP_VERSION_1;
  std::__cxx11::string::string((string *)&this->communityString);
  Catch::clara::std::deque<VarBind,_std::allocator<VarBind>_>::deque
            ((deque<VarBind,_std::allocator<VarBind>_> *)&this->varbindList);
  (this->errorStatus).errorStatus = NO_ERROR;
  (this->errorIndex).errorIndex = 0;
  this->packet = (ComplexType *)0x0;
  return;
}

Assistant:

SNMPPacket(){}